

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall Map::showMap(Map *this)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  string local_50;
  
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < this->gameMap->vertexCount; lVar2 = lVar2 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar2);
    poVar1 = std::operator<<(poVar1,". ");
    GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    toString(&local_50,
             (GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&this->gameMap->vertexList->index + lVar3));
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_50);
    lVar3 = lVar3 + 0x48;
  }
  return;
}

Assistant:

void Map::showMap() {
    for (int i = 0; i < gameMap->getVertexCount(); i++)
    {
        cout << (i) << ". " << gameMap->getVertex(i)->toString() << endl;
        // Player can be in all vertices except Manhattan (0) , since it can be in its subvertices
    }
}